

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

void xmlCleanupCharEncodingHandlers(void)

{
  char *pcVar1;
  
  xmlCleanupEncodingAliases();
  if (handlers != (xmlCharEncodingHandlerPtr *)0x0) {
    while (0 < nbCharEncodingHandler) {
      nbCharEncodingHandler = nbCharEncodingHandler - 1;
      if (handlers[(uint)nbCharEncodingHandler] != (xmlCharEncodingHandlerPtr)0x0) {
        pcVar1 = handlers[(uint)nbCharEncodingHandler]->name;
        if (pcVar1 != (char *)0x0) {
          (*xmlFree)(pcVar1);
        }
        (*xmlFree)(handlers[nbCharEncodingHandler]);
      }
    }
    (*xmlFree)(handlers);
    handlers = (xmlCharEncodingHandlerPtr *)0x0;
    nbCharEncodingHandler = 0;
  }
  return;
}

Assistant:

void
xmlCleanupCharEncodingHandlers(void) {
    xmlCleanupEncodingAliases();

    if (handlers == NULL) return;

    for (;nbCharEncodingHandler > 0;) {
        nbCharEncodingHandler--;
	if (handlers[nbCharEncodingHandler] != NULL) {
	    if (handlers[nbCharEncodingHandler]->name != NULL)
		xmlFree(handlers[nbCharEncodingHandler]->name);
	    xmlFree(handlers[nbCharEncodingHandler]);
	}
    }
    xmlFree(handlers);
    handlers = NULL;
    nbCharEncodingHandler = 0;
    xmlDefaultCharEncodingHandler = NULL;
}